

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderOperatorTests.cpp
# Opt level: O2

void deqp::gles2::Functional::evalSequenceNoSideEffCase0(ShaderEvalContext *ctx)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [12];
  Vector<float,_4> local_48;
  Vector<float,_4> local_38;
  undefined8 local_20;
  undefined8 uStack_18;
  
  auVar1 = *(undefined1 (*) [16])ctx->in[0].m_data;
  auVar2 = auVar1._4_12_;
  local_38.m_data[3] = auVar1._0_4_;
  local_38.m_data[0] = (float)auVar2._0_4_;
  local_38.m_data[1] = (float)auVar2._4_4_;
  local_38.m_data[2] = (float)auVar2._8_4_;
  local_48.m_data[3] = ctx->in[1].m_data[0];
  local_48.m_data[2] = ctx->in[1].m_data[1];
  local_48.m_data[1] = ctx->in[1].m_data[2];
  local_48.m_data[0] = ctx->in[1].m_data[3];
  tcu::operator+((tcu *)&local_20,&local_48,&local_38);
  *(undefined8 *)(ctx->color).m_data = local_20;
  *(undefined8 *)((ctx->color).m_data + 2) = uStack_18;
  return;
}

Assistant:

void evalSequenceNoSideEffCase0	(ShaderEvalContext& ctx) { ctx.color		= sequenceNoSideEffCase0(ctx.in[0].swizzle(1, 2, 3, 0), ctx.in[1].swizzle(3, 2, 1, 0), ctx.in[2].swizzle(0, 3, 2, 1)); }